

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  int iVar9;
  int *piVar10;
  undefined4 *puVar11;
  Layer *pLVar12;
  void *pvVar13;
  float *pfVar14;
  undefined1 auVar15 [32];
  bool bVar16;
  size_t sVar17;
  Mat *pMVar18;
  undefined8 uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 (*pauVar37) [32];
  ulong uVar38;
  undefined1 (*pauVar39) [16];
  int iVar40;
  size_t sVar41;
  void *pvVar42;
  ulong uVar43;
  long lVar44;
  void *pvVar45;
  uint uVar46;
  uint _elempack;
  int x;
  ulong uVar47;
  float __x;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar95 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  ulong local_2b8;
  ulong local_288;
  float *local_260;
  void *local_230;
  Mat local_228;
  void *local_1e0;
  void *local_1d8;
  Mat *local_1d0;
  Option opt_p;
  Mat local_178;
  long local_130;
  long local_128;
  void *local_120;
  long local_118;
  void *local_110;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined8 uVar7;
  undefined1 auVar68 [32];
  undefined1 auVar85 [32];
  undefined1 auVar96 [32];
  
  iVar26 = bottom_blob->w;
  iVar34 = bottom_blob->h;
  uVar32 = bottom_blob->elemsize;
  iVar25 = bottom_blob->elempack;
  if (opt->use_packing_layout == true) {
    uVar46 = (this->super_DeconvolutionDepthWise).num_output;
    uVar33 = (uint)((uVar46 & 3) == 0) * 3 + 1;
    if ((uVar46 & 7) == 0) {
      uVar33 = 8;
    }
  }
  else {
    uVar33 = 1;
  }
  iVar35 = (this->super_DeconvolutionDepthWise).kernel_w;
  iVar40 = (this->super_DeconvolutionDepthWise).stride_w;
  iVar30 = ((this->super_DeconvolutionDepthWise).kernel_h + -1) *
           (this->super_DeconvolutionDepthWise).dilation_h;
  iVar20 = (this->super_DeconvolutionDepthWise).dilation_w;
  iVar21 = (this->super_DeconvolutionDepthWise).stride_h;
  iVar9 = (this->super_DeconvolutionDepthWise).output_pad_right;
  iVar31 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  uVar46 = bottom_blob->c;
  uVar29 = (ulong)uVar46;
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  auVar94._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar94._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar94._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar94._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  auVar94 = vpcmpgtd_avx(auVar94,(undefined1  [16])0x0);
  lVar44 = 0x10;
  if (((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar94 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar94[0xf]) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar44 = 8, &local_228 != top_blob))
     )) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    local_228.data = top_blob->data;
    local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_228.elemsize = top_blob->elemsize;
    local_228.elempack = top_blob->elempack;
    local_228.allocator = top_blob->allocator;
    uVar4 = top_blob->dims;
    uVar5 = top_blob->w;
    uVar6 = top_blob->h;
    uVar8 = top_blob->d;
    uVar7 = CONCAT44(uVar8,uVar6);
    local_228.c = top_blob->c;
    local_228.cstep = top_blob->cstep;
    local_228.dims = uVar4;
    local_228.w = uVar5;
    local_228._48_8_ = uVar7;
  }
  iVar20 = (iVar35 + -1) * iVar20;
  iVar35 = iVar9 + (iVar26 + -1) * iVar40 + iVar20 + 1;
  iVar40 = iVar31 + (iVar34 + -1) * iVar21 + iVar30 + 1;
  sVar41 = (uVar32 / (ulong)(long)iVar25) * (ulong)uVar33;
  local_1d0 = top_blob;
  Mat::create(&local_228,iVar35,iVar40,(this->super_DeconvolutionDepthWise).num_output / (int)uVar33
              ,sVar41,uVar33,*(Allocator **)(&opt->lightmode + lVar44));
  if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
    iVar21 = (this->super_DeconvolutionDepthWise).num_output;
    iVar9 = (this->super_DeconvolutionDepthWise).group;
    if (iVar9 == iVar21 && iVar25 * uVar46 == iVar9) {
      iVar21 = (this->super_DeconvolutionDepthWise).kernel_h *
               (this->super_DeconvolutionDepthWise).kernel_w;
      if (iVar25 == 1) {
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        uVar32 = 0;
        if (iVar40 < 1) {
          iVar40 = 0;
        }
        if ((int)uVar46 < 1) {
          uVar29 = 0;
        }
        local_110 = local_228.data;
        local_118 = local_228.cstep * local_228.elemsize;
        local_230 = (this->weight_data_tm).data;
        local_120 = bottom_blob->data;
        local_128 = bottom_blob->cstep * bottom_blob->elemsize;
        local_1d8 = (void *)((long)bottom_blob->w * bottom_blob->elemsize);
        local_130 = (long)iVar21 << 2;
        for (; pvVar42 = local_120, uVar32 != uVar29; uVar32 = uVar32 + 1) {
          local_260 = (float *)(local_118 * uVar32 + (long)local_110);
          lVar44 = local_128 * uVar32;
          for (iVar25 = 0; iVar25 != iVar40; iVar25 = iVar25 + 1) {
            uVar33 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar21 = (this->super_DeconvolutionDepthWise).bias_term;
            pvVar13 = (this->super_DeconvolutionDepthWise).bias_data.data;
            pfVar14 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
            if ((int)uVar33 < 1) {
              uVar33 = 0;
            }
            local_1e0 = (void *)(ulong)((this->super_DeconvolutionDepthWise).activation_type - 1);
            iVar9 = -iVar20;
            for (iVar31 = 0; iVar31 != iVar35; iVar31 = iVar31 + 1) {
              if (iVar21 == 0) {
                auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar56 = ZEXT464(*(uint *)((long)pvVar13 + uVar32 * 4));
              }
              iVar2 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar46 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar38 = 0;
              if (0 < (int)uVar46) {
                uVar38 = (ulong)uVar46;
              }
              iVar36 = (this->super_DeconvolutionDepthWise).stride_w;
              pvVar45 = local_230;
              for (uVar43 = 0; uVar43 != uVar33; uVar43 = uVar43 + 1) {
                iVar27 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar43 +
                         (iVar25 - iVar30);
                if ((-1 < iVar27) &&
                   (iVar28 = iVar27 / iVar2, iVar28 < iVar34 && iVar27 % iVar2 == 0)) {
                  iVar27 = iVar9;
                  for (uVar47 = 0; uVar38 != uVar47; uVar47 = uVar47 + 1) {
                    if ((-1 < iVar27) &&
                       (iVar22 = iVar27 / iVar36, iVar22 < iVar26 && iVar27 % iVar36 == 0)) {
                      auVar94 = vfmadd231ss_fma(auVar56._0_16_,
                                                ZEXT416(*(uint *)((long)pvVar45 + uVar47 * 4)),
                                                ZEXT416(*(uint *)((long)pvVar42 +
                                                                 (long)iVar22 * 4 +
                                                                 (long)iVar28 * (long)local_1d8 +
                                                                 lVar44)));
                      auVar56 = ZEXT1664(auVar94);
                    }
                    iVar27 = iVar27 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar45 = (void *)((long)pvVar45 + (long)(int)uVar46 * 4);
              }
              auVar94 = auVar56._0_16_;
              __x = auVar56._0_4_;
              fVar48 = __x;
              if ((uint)local_1e0 < 6) {
                switch((long)&switchD_003ed5c4::switchdataD_00542040 +
                       (long)(int)(&switchD_003ed5c4::switchdataD_00542040)[(long)local_1e0]) {
                case 0x3ed5c6:
                  auVar94 = vmaxss_avx(auVar94,ZEXT416(0));
                  fVar48 = auVar94._0_4_;
                  break;
                case 0x3ed5d3:
                  fVar48 = expf(__x);
                  fVar48 = logf(fVar48 + 1.0);
                  fVar48 = tanhf(fVar48);
                  fVar48 = fVar48 * __x;
                  break;
                case 0x3ed608:
                  auVar94 = vmaxss_avx(auVar94,ZEXT416((uint)*pfVar14));
                  fVar48 = auVar94._0_4_;
                  if (pfVar14[1] < auVar94._0_4_) {
                    fVar48 = pfVar14[1];
                  }
                  break;
                case 0x3ed62c:
                  auVar94 = vminss_avx(auVar94,ZEXT416(0x42b0c0a5));
                  auVar150._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                  auVar150._8_4_ = auVar94._8_4_ ^ 0x80000000;
                  auVar150._12_4_ = auVar94._12_4_ ^ 0x80000000;
                  auVar94 = vcmpss_avx(auVar94,ZEXT416(0xc2b0c0a5),1);
                  auVar80._8_4_ = 0x42b0c0a5;
                  auVar80._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar80._12_4_ = 0x42b0c0a5;
                  auVar94 = vblendvps_avx(auVar150,auVar80,auVar94);
                  fVar48 = expf(auVar94._0_4_);
                  fVar48 = 1.0 / (fVar48 + 1.0);
                  break;
                case 0x3ed67c:
                  auVar94 = vcmpss_avx(ZEXT816(0) << 0x40,auVar94,1);
                  auVar81._8_4_ = 0x3f800000;
                  auVar81._0_8_ = 0x3f8000003f800000;
                  auVar81._12_4_ = 0x3f800000;
                  auVar94 = vblendvps_avx(ZEXT416((uint)*pfVar14),auVar81,auVar94);
                  fVar48 = auVar94._0_4_ * __x;
                  break;
                case 0x3ed6a6:
                  fVar3 = *pfVar14;
                  fVar92 = -pfVar14[1] / fVar3;
                  fVar48 = 0.0;
                  if ((fVar92 <= __x) && (fVar48 = __x, __x <= fVar92 + 1.0 / fVar3)) {
                    auVar94 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar94,ZEXT416((uint)pfVar14[1])
                                             );
                    fVar48 = auVar94._0_4_ * __x;
                  }
                }
              }
              *local_260 = fVar48;
              local_260 = local_260 + 1;
              iVar9 = iVar9 + 1;
            }
          }
          local_230 = (void *)((long)local_230 + local_130);
        }
      }
      else if (iVar25 == 4) {
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (iVar40 < 1) {
          iVar40 = 0;
        }
        if ((int)uVar46 < 1) {
          uVar29 = 0;
        }
        auVar149 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar160 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar161 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar115._8_4_ = 0x3f000000;
        auVar115._0_8_ = 0x3f0000003f000000;
        auVar115._12_4_ = 0x3f000000;
        auVar118 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar147 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar162 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar114 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar70 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        auVar56 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
        auVar142 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
        iVar25 = 0;
        for (uVar32 = 0; uVar32 != uVar29; uVar32 = uVar32 + 1) {
          pauVar39 = (undefined1 (*) [16])
                     (local_228.cstep * uVar32 * local_228.elemsize + (long)local_228.data);
          iVar9 = bottom_blob->w;
          sVar41 = bottom_blob->elemsize;
          local_1d8 = (void *)(bottom_blob->cstep * uVar32 * sVar41 + (long)bottom_blob->data);
          local_1e0 = (void *)((long)iVar25 * 4 + (long)(this->weight_data_tm).data);
          for (iVar31 = 0; iVar31 != iVar40; iVar31 = iVar31 + 1) {
            iVar2 = -iVar20;
            for (iVar36 = 0; iVar36 != iVar35; iVar36 = iVar36 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar94 = ZEXT816(0) << 0x40;
              }
              else {
                auVar94 = *(undefined1 (*) [16])
                           ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                           uVar32 * 0x10);
              }
              auVar169 = ZEXT1664(auVar94);
              iVar27 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar33 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar46 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar38 = 0;
              if (0 < (int)uVar33) {
                uVar38 = (ulong)uVar33;
              }
              iVar28 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar46 < 1) {
                uVar46 = 0;
              }
              pvVar42 = local_1e0;
              for (uVar43 = 0; uVar43 != uVar46; uVar43 = uVar43 + 1) {
                iVar22 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar43 +
                         (iVar31 - iVar30);
                if ((-1 < iVar22) &&
                   (iVar23 = iVar22 / iVar27, iVar23 < iVar34 && iVar22 % iVar27 == 0)) {
                  iVar22 = iVar2;
                  for (lVar44 = 0; uVar38 * 0x10 != lVar44; lVar44 = lVar44 + 0x10) {
                    if ((-1 < iVar22) &&
                       (iVar24 = iVar22 / iVar28, iVar24 < iVar26 && iVar22 % iVar28 == 0)) {
                      auVar94 = vfmadd231ps_fma(auVar169._0_16_,
                                                *(undefined1 (*) [16])
                                                 ((long)local_1d8 +
                                                 (long)(iVar24 << 2) * 4 +
                                                 (long)iVar23 * (long)iVar9 * sVar41),
                                                *(undefined1 (*) [16])((long)pvVar42 + lVar44));
                      auVar169 = ZEXT1664(auVar94);
                    }
                    iVar22 = iVar22 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar42 = (void *)((long)pvVar42 + (long)(int)uVar33 * 0x10);
              }
              iVar27 = (this->super_DeconvolutionDepthWise).activation_type;
              auVar94 = auVar169._0_16_;
              auVar59 = auVar94;
              if (iVar27 - 1U < 6) {
                auVar59 = vmaxps_avx(auVar94,_DAT_005370d0);
                auVar81 = auVar118._0_16_;
                auVar150 = auVar56._0_16_;
                auVar65 = auVar147._0_16_;
                auVar80 = auVar114._0_16_;
                auVar113 = auVar70._0_16_;
                auVar77 = auVar162._0_16_;
                auVar61 = auVar161._0_16_;
                auVar60 = auVar160._0_16_;
                auVar79 = auVar149._0_16_;
                switch(iVar27) {
                case 2:
                  auVar94 = vminps_avx(auVar94,_DAT_005370d0);
                  uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar143._4_4_ = uVar1;
                  auVar143._0_4_ = uVar1;
                  auVar143._8_4_ = uVar1;
                  auVar143._12_4_ = uVar1;
                  auVar59 = vfmadd231ps_fma(auVar59,auVar94,auVar143);
                  break;
                case 3:
                  puVar11 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar11;
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  uVar1 = puVar11[1];
                  auVar145._4_4_ = uVar1;
                  auVar145._0_4_ = uVar1;
                  auVar145._8_4_ = uVar1;
                  auVar145._12_4_ = uVar1;
                  auVar94 = vmaxps_avx(auVar94,auVar62);
                  auVar59 = vminps_avx(auVar145,auVar94);
                  break;
                case 4:
                  auVar63._0_8_ = auVar169._0_8_ ^ 0x8000000080000000;
                  auVar63._8_4_ = -auVar169._8_4_;
                  auVar63._12_4_ = -auVar169._12_4_;
                  auVar94 = vminps_avx(auVar79,auVar63);
                  auVar79 = vmaxps_avx(auVar60,auVar94);
                  auVar94 = vfmadd213ps_fma(auVar61,auVar79,auVar115);
                  auVar163._0_4_ = (int)auVar94._0_4_;
                  auVar163._4_4_ = (int)auVar94._4_4_;
                  auVar163._8_4_ = (int)auVar94._8_4_;
                  auVar163._12_4_ = (int)auVar94._12_4_;
                  auVar59 = vcvtdq2ps_avx(auVar163);
                  auVar94 = vcmpps_avx(auVar94,auVar59,1);
                  auVar94 = vandps_avx(auVar94,auVar81);
                  auVar94 = vsubps_avx(auVar59,auVar94);
                  auVar59 = vfmsub231ps_fma(auVar79,auVar94,auVar65);
                  auVar78._8_4_ = 0x395e8083;
                  auVar78._0_8_ = 0x395e8083395e8083;
                  auVar78._12_4_ = 0x395e8083;
                  auVar59 = vfmsub231ps_fma(auVar59,auVar94,auVar78);
                  auVar164._0_4_ = auVar59._0_4_ * auVar59._0_4_;
                  auVar164._4_4_ = auVar59._4_4_ * auVar59._4_4_;
                  auVar164._8_4_ = auVar59._8_4_ * auVar59._8_4_;
                  auVar164._12_4_ = auVar59._12_4_ * auVar59._12_4_;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar59,auVar77);
                  auVar80 = vfmadd213ps_fma(auVar80,auVar59,auVar113);
                  auVar150 = vfmadd213ps_fma(auVar80,auVar59,auVar150);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar59,auVar142._0_16_);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar59,auVar115);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar164,auVar59);
                  auVar64._0_4_ = auVar150._0_4_ + auVar118._0_4_;
                  auVar64._4_4_ = auVar150._4_4_ + auVar118._4_4_;
                  auVar64._8_4_ = auVar150._8_4_ + auVar118._8_4_;
                  auVar64._12_4_ = auVar150._12_4_ + auVar118._12_4_;
                  auVar146._0_4_ = (int)auVar94._0_4_;
                  auVar146._4_4_ = (int)auVar94._4_4_;
                  auVar146._8_4_ = (int)auVar94._8_4_;
                  auVar146._12_4_ = (int)auVar94._12_4_;
                  auVar94 = vpslld_avx(auVar146,0x17);
                  auVar94 = vpaddd_avx(auVar94,auVar81);
                  auVar94 = vfmadd213ps_fma(auVar94,auVar64,auVar81);
                  auVar59 = vdivps_avx(auVar81,auVar94);
                  break;
                case 5:
                  auVar59 = vminps_avx(auVar94,auVar79);
                  auVar72 = vmaxps_avx(auVar60,auVar59);
                  auVar59 = vfmadd213ps_fma(auVar61,auVar72,auVar115);
                  auVar151._0_4_ = (int)auVar59._0_4_;
                  auVar151._4_4_ = (int)auVar59._4_4_;
                  auVar151._8_4_ = (int)auVar59._8_4_;
                  auVar151._12_4_ = (int)auVar59._12_4_;
                  auVar58 = vcvtdq2ps_avx(auVar151);
                  auVar59 = vcmpps_avx(auVar59,auVar58,1);
                  auVar59 = vandps_avx(auVar59,auVar81);
                  auVar59 = vsubps_avx(auVar58,auVar59);
                  auVar58 = vfmsub231ps_fma(auVar72,auVar59,auVar65);
                  auVar72._8_4_ = 0xb95e8083;
                  auVar72._0_8_ = 0xb95e8083b95e8083;
                  auVar72._12_4_ = 0xb95e8083;
                  auVar72 = vfnmsub231ps_fma(auVar58,auVar59,auVar72);
                  auVar152._0_4_ = auVar72._0_4_ * auVar72._0_4_;
                  auVar152._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                  auVar152._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                  auVar152._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                  auVar58 = vfmadd213ps_fma(auVar80,auVar72,auVar77);
                  auVar58 = vfmadd213ps_fma(auVar58,auVar72,auVar113);
                  auVar58 = vfmadd213ps_fma(auVar58,auVar72,auVar150);
                  auVar58 = vfmadd213ps_fma(auVar58,auVar72,auVar142._0_16_);
                  auVar58 = vfmadd213ps_fma(auVar58,auVar72,auVar115);
                  auVar58 = vfmadd213ps_fma(auVar58,auVar152,auVar72);
                  auVar73._0_4_ = auVar58._0_4_ + auVar118._0_4_;
                  auVar73._4_4_ = auVar58._4_4_ + auVar118._4_4_;
                  auVar73._8_4_ = auVar58._8_4_ + auVar118._8_4_;
                  auVar73._12_4_ = auVar58._12_4_ + auVar118._12_4_;
                  auVar58._0_4_ = (int)auVar59._0_4_;
                  auVar58._4_4_ = (int)auVar59._4_4_;
                  auVar58._8_4_ = (int)auVar59._8_4_;
                  auVar58._12_4_ = (int)auVar59._12_4_;
                  auVar59 = vpslld_avx(auVar58,0x17);
                  auVar59 = vpaddd_avx(auVar59,auVar81);
                  auVar73 = vfmadd213ps_fma(auVar59,auVar73,auVar81);
                  auVar74._8_4_ = 0x800000;
                  auVar74._0_8_ = 0x80000000800000;
                  auVar74._12_4_ = 0x800000;
                  auVar81 = vmaxps_avx(auVar73,auVar74);
                  auVar59 = vpsrld_avx(auVar81,0x17);
                  auVar105._8_4_ = 0xffffff82;
                  auVar105._0_8_ = 0xffffff82ffffff82;
                  auVar105._12_4_ = 0xffffff82;
                  auVar59 = vpaddd_avx(auVar59,auVar105);
                  auVar106._8_4_ = 0x807fffff;
                  auVar106._0_8_ = 0x807fffff807fffff;
                  auVar106._12_4_ = 0x807fffff;
                  auVar81 = vandps_avx(auVar81,auVar106);
                  auVar72 = vorps_avx(auVar81,auVar115);
                  auVar58 = vcvtdq2ps_avx(auVar59);
                  auVar107._8_4_ = 0x3f3504f3;
                  auVar107._0_8_ = 0x3f3504f33f3504f3;
                  auVar107._12_4_ = 0x3f3504f3;
                  auVar59 = vcmpps_avx(auVar72,auVar107,1);
                  auVar81 = vandps_avx(auVar59,auVar72);
                  auVar75._0_4_ = auVar72._0_4_ + -1.0 + auVar81._0_4_;
                  auVar75._4_4_ = auVar72._4_4_ + -1.0 + auVar81._4_4_;
                  auVar75._8_4_ = auVar72._8_4_ + -1.0 + auVar81._8_4_;
                  auVar75._12_4_ = auVar72._12_4_ + -1.0 + auVar81._12_4_;
                  auVar108._8_4_ = 0x3f800000;
                  auVar108._0_8_ = 0x3f8000003f800000;
                  auVar108._12_4_ = 0x3f800000;
                  auVar81 = vandps_avx(auVar59,auVar108);
                  auVar59 = vsubps_avx(auVar58,auVar81);
                  auVar144._0_4_ = auVar75._0_4_ * auVar75._0_4_;
                  auVar144._4_4_ = auVar75._4_4_ * auVar75._4_4_;
                  auVar144._8_4_ = auVar75._8_4_ * auVar75._8_4_;
                  auVar144._12_4_ = auVar75._12_4_ * auVar75._12_4_;
                  auVar153._8_4_ = 0x3d9021bb;
                  auVar153._0_8_ = 0x3d9021bb3d9021bb;
                  auVar153._12_4_ = 0x3d9021bb;
                  auVar120._8_4_ = 0xbdebd1b8;
                  auVar120._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar120._12_4_ = 0xbdebd1b8;
                  auVar81 = vfmadd213ps_fma(auVar153,auVar75,auVar120);
                  auVar121._8_4_ = 0x3def251a;
                  auVar121._0_8_ = 0x3def251a3def251a;
                  auVar121._12_4_ = 0x3def251a;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar121);
                  auVar122._8_4_ = 0xbdfe5d4f;
                  auVar122._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar122._12_4_ = 0xbdfe5d4f;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar122);
                  auVar123._8_4_ = 0x3e11e9bf;
                  auVar123._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar123._12_4_ = 0x3e11e9bf;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar123);
                  auVar124._8_4_ = 0xbe2aae50;
                  auVar124._0_8_ = 0xbe2aae50be2aae50;
                  auVar124._12_4_ = 0xbe2aae50;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar124);
                  auVar125._8_4_ = 0x3e4cceac;
                  auVar125._0_8_ = 0x3e4cceac3e4cceac;
                  auVar125._12_4_ = 0x3e4cceac;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar125);
                  auVar126._8_4_ = 0xbe7ffffc;
                  auVar126._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar126._12_4_ = 0xbe7ffffc;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar126);
                  auVar127._8_4_ = 0x3eaaaaaa;
                  auVar127._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar127._12_4_ = 0x3eaaaaaa;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar75,auVar127);
                  auVar148._0_4_ = auVar144._0_4_ * auVar75._0_4_ * auVar81._0_4_;
                  auVar148._4_4_ = auVar144._4_4_ * auVar75._4_4_ * auVar81._4_4_;
                  auVar148._8_4_ = auVar144._8_4_ * auVar75._8_4_ * auVar81._8_4_;
                  auVar148._12_4_ = auVar144._12_4_ * auVar75._12_4_ * auVar81._12_4_;
                  auVar154._8_4_ = 0xb95e8083;
                  auVar154._0_8_ = 0xb95e8083b95e8083;
                  auVar154._12_4_ = 0xb95e8083;
                  auVar81 = vfmadd231ps_fma(auVar148,auVar59,auVar154);
                  auVar58 = vfmsub231ps_fma(auVar81,auVar115,auVar144);
                  auVar81 = vcmpps_avx(auVar73,_DAT_005370d0,2);
                  auVar58 = vsubps_avx(auVar58,auVar75);
                  auVar149 = ZEXT1664(auVar79);
                  auVar160 = ZEXT1664(auVar60);
                  auVar161 = ZEXT1664(auVar61);
                  auVar162 = ZEXT1664(auVar77);
                  auVar70 = ZEXT1664(auVar113);
                  auVar114 = ZEXT1664(auVar80);
                  auVar147 = ZEXT1664(auVar65);
                  auVar56 = ZEXT1664(auVar150);
                  auVar59 = vfnmadd231ps_fma(auVar58,auVar65,auVar59);
                  auVar76._0_4_ = auVar59._0_4_ + auVar59._0_4_;
                  auVar76._4_4_ = auVar59._4_4_ + auVar59._4_4_;
                  auVar76._8_4_ = auVar59._8_4_ + auVar59._8_4_;
                  auVar76._12_4_ = auVar59._12_4_ + auVar59._12_4_;
                  auVar109._8_4_ = 0x7fffffff;
                  auVar109._0_8_ = 0x7fffffff7fffffff;
                  auVar109._12_4_ = 0x7fffffff;
                  auVar81 = vblendvps_avx(auVar76,auVar109,auVar81);
                  auVar81 = vminps_avx(auVar79,auVar81);
                  auVar79 = vmaxps_avx(auVar60,auVar81);
                  auVar81 = vfmadd213ps_fma(auVar61,auVar79,auVar115);
                  auVar110._0_4_ = (int)auVar81._0_4_;
                  auVar110._4_4_ = (int)auVar81._4_4_;
                  auVar110._8_4_ = (int)auVar81._8_4_;
                  auVar110._12_4_ = (int)auVar81._12_4_;
                  auVar59 = vcvtdq2ps_avx(auVar110);
                  auVar81 = vcmpps_avx(auVar81,auVar59,1);
                  auVar128._8_4_ = 0x3f800000;
                  auVar128._0_8_ = 0x3f8000003f800000;
                  auVar128._12_4_ = 0x3f800000;
                  auVar81 = vandps_avx(auVar81,auVar128);
                  auVar129._8_4_ = 0x3e2aaaaa;
                  auVar129._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar129._12_4_ = 0x3e2aaaaa;
                  auVar142 = ZEXT1664(auVar129);
                  auVar81 = vsubps_avx(auVar59,auVar81);
                  auVar59 = vfmsub231ps_fma(auVar79,auVar81,auVar65);
                  auVar111._8_4_ = 0xb95e8083;
                  auVar111._0_8_ = 0xb95e8083b95e8083;
                  auVar111._12_4_ = 0xb95e8083;
                  auVar59 = vfnmsub231ps_fma(auVar59,auVar81,auVar111);
                  auVar112._0_4_ = auVar59._0_4_ * auVar59._0_4_;
                  auVar112._4_4_ = auVar59._4_4_ * auVar59._4_4_;
                  auVar112._8_4_ = auVar59._8_4_ * auVar59._8_4_;
                  auVar112._12_4_ = auVar59._12_4_ * auVar59._12_4_;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar59,auVar77);
                  auVar80 = vfmadd213ps_fma(auVar80,auVar59,auVar113);
                  auVar150 = vfmadd213ps_fma(auVar80,auVar59,auVar150);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar59,auVar129);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar59,auVar115);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar112,auVar59);
                  auVar113._8_4_ = 0x3f800000;
                  auVar113._0_8_ = 0x3f8000003f800000;
                  auVar113._12_4_ = 0x3f800000;
                  auVar118 = ZEXT1664(auVar113);
                  auVar60._0_4_ = auVar150._0_4_ + 1.0;
                  auVar60._4_4_ = auVar150._4_4_ + 1.0;
                  auVar60._8_4_ = auVar150._8_4_ + 1.0;
                  auVar60._12_4_ = auVar150._12_4_ + 1.0;
                  auVar77._0_4_ = (int)auVar81._0_4_;
                  auVar77._4_4_ = (int)auVar81._4_4_;
                  auVar77._8_4_ = (int)auVar81._8_4_;
                  auVar77._12_4_ = (int)auVar81._12_4_;
                  auVar150 = vpslld_avx(auVar77,0x17);
                  auVar150 = vpaddd_avx(auVar150,auVar113);
                  auVar150 = vfmadd213ps_fma(auVar150,auVar60,auVar113);
                  auVar61._8_4_ = 0x40000000;
                  auVar61._0_8_ = 0x4000000040000000;
                  auVar61._12_4_ = 0x40000000;
                  auVar150 = vdivps_avx(auVar61,auVar150);
                  auVar59 = vfmsub213ps_fma(auVar150,auVar94,auVar94);
                  break;
                case 6:
                  puVar11 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar11;
                  auVar65._4_4_ = uVar1;
                  auVar65._0_4_ = uVar1;
                  auVar65._8_4_ = uVar1;
                  auVar65._12_4_ = uVar1;
                  uVar1 = puVar11[1];
                  auVar79._4_4_ = uVar1;
                  auVar79._0_4_ = uVar1;
                  auVar79._8_4_ = uVar1;
                  auVar79._12_4_ = uVar1;
                  auVar94 = vfmadd231ps_fma(auVar79,auVar94,auVar65);
                  auVar94 = vmaxps_avx(auVar94,_DAT_005370d0);
                  auVar94 = vminps_avx(auVar94,auVar81);
                  auVar59._0_4_ = auVar169._0_4_ * auVar94._0_4_;
                  auVar59._4_4_ = auVar169._4_4_ * auVar94._4_4_;
                  auVar59._8_4_ = auVar169._8_4_ * auVar94._8_4_;
                  auVar59._12_4_ = auVar169._12_4_ * auVar94._12_4_;
                }
              }
              *pauVar39 = auVar59;
              pauVar39 = pauVar39 + 1;
              iVar2 = iVar2 + 1;
            }
          }
          iVar25 = iVar25 + iVar21 * 4;
        }
      }
      else if (iVar25 == 8) {
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (iVar40 < 1) {
          iVar40 = 0;
        }
        if ((int)uVar46 < 1) {
          uVar29 = 0;
        }
        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar160 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar114 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar161 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar118 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar142 = ZEXT3264(CONCAT428(0x3f318000,
                                      CONCAT424(0x3f318000,
                                                CONCAT420(0x3f318000,
                                                          CONCAT416(0x3f318000,
                                                                    CONCAT412(0x3f318000,
                                                                              CONCAT48(0x3f318000,
                                                                                                                                                                              
                                                  0x3f3180003f318000)))))));
        auVar162 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar149 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar147 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        iVar25 = 0;
        for (uVar32 = 0; uVar32 != uVar29; uVar32 = uVar32 + 1) {
          pauVar37 = (undefined1 (*) [32])
                     (local_228.cstep * uVar32 * local_228.elemsize + (long)local_228.data);
          iVar9 = bottom_blob->w;
          sVar41 = bottom_blob->elemsize;
          local_1d8 = (void *)(bottom_blob->cstep * uVar32 * sVar41 + (long)bottom_blob->data);
          local_1e0 = (void *)((long)iVar25 * 4 + (long)(this->weight_data_tm).data);
          for (iVar31 = 0; iVar31 != iVar40; iVar31 = iVar31 + 1) {
            iVar2 = -iVar20;
            for (iVar36 = 0; iVar36 != iVar35; iVar36 = iVar36 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar70 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar70 = ZEXT3264(*(undefined1 (*) [32])
                                    ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                    uVar32 * 0x20));
              }
              iVar27 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar33 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar46 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar38 = 0;
              if (0 < (int)uVar33) {
                uVar38 = (ulong)uVar33;
              }
              iVar28 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar46 < 1) {
                uVar46 = 0;
              }
              pvVar42 = local_1e0;
              for (uVar43 = 0; uVar43 != uVar46; uVar43 = uVar43 + 1) {
                iVar22 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar43 +
                         (iVar31 - iVar30);
                if ((-1 < iVar22) &&
                   (iVar23 = iVar22 / iVar27, iVar23 < iVar34 && iVar22 % iVar27 == 0)) {
                  iVar22 = iVar2;
                  for (lVar44 = 0; uVar38 * 0x20 != lVar44; lVar44 = lVar44 + 0x20) {
                    if ((-1 < iVar22) &&
                       (iVar24 = iVar22 / iVar28, iVar24 < iVar26 && iVar22 % iVar28 == 0)) {
                      auVar94 = vfmadd231ps_fma(auVar70._0_32_,
                                                *(undefined1 (*) [32])
                                                 ((long)local_1d8 +
                                                 (long)(iVar24 << 3) * 4 +
                                                 (long)iVar23 * (long)iVar9 * sVar41),
                                                *(undefined1 (*) [32])((long)pvVar42 + lVar44));
                      auVar70 = ZEXT1664(auVar94);
                    }
                    iVar22 = iVar22 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar42 = (void *)((long)pvVar42 + (long)(int)uVar33 * 0x20);
              }
              iVar27 = (this->super_DeconvolutionDepthWise).activation_type;
              auVar67 = auVar70._0_32_;
              auVar90 = auVar67;
              if (5 < iVar27 - 1U) goto switchD_003ec368_caseD_1;
              auVar50 = auVar56._0_32_;
              auVar90 = vmaxps_avx(auVar67,auVar50);
              auVar116 = auVar118._0_32_;
              auVar104 = auVar114._0_32_;
              auVar85 = auVar142._0_32_;
              auVar100 = auVar160._0_32_;
              auVar117 = auVar161._0_32_;
              auVar99 = auVar149._0_32_;
              auVar140 = auVar162._0_32_;
              auVar86 = auVar147._0_32_;
              switch(iVar27) {
              case 2:
                auVar67 = vminps_avx(auVar67,auVar50);
                uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar165._4_4_ = uVar1;
                auVar165._0_4_ = uVar1;
                auVar165._8_4_ = uVar1;
                auVar165._12_4_ = uVar1;
                auVar165._16_4_ = uVar1;
                auVar165._20_4_ = uVar1;
                auVar165._24_4_ = uVar1;
                auVar165._28_4_ = uVar1;
                auVar94 = vfmadd231ps_fma(auVar90,auVar67,auVar165);
                auVar90 = ZEXT1632(auVar94);
                break;
              case 3:
                puVar11 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar1 = *puVar11;
                auVar87._4_4_ = uVar1;
                auVar87._0_4_ = uVar1;
                auVar87._8_4_ = uVar1;
                auVar87._12_4_ = uVar1;
                auVar87._16_4_ = uVar1;
                auVar87._20_4_ = uVar1;
                auVar87._24_4_ = uVar1;
                auVar87._28_4_ = uVar1;
                uVar1 = puVar11[1];
                auVar168._4_4_ = uVar1;
                auVar168._0_4_ = uVar1;
                auVar168._8_4_ = uVar1;
                auVar168._12_4_ = uVar1;
                auVar168._16_4_ = uVar1;
                auVar168._20_4_ = uVar1;
                auVar168._24_4_ = uVar1;
                auVar168._28_4_ = uVar1;
                auVar90 = vmaxps_avx(auVar67,auVar87);
                auVar90 = vminps_avx(auVar168,auVar90);
                break;
              case 4:
                auVar66._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
                auVar66._8_4_ = -auVar70._8_4_;
                auVar66._12_4_ = -auVar70._12_4_;
                auVar66._16_4_ = -auVar70._16_4_;
                auVar66._20_4_ = -auVar70._20_4_;
                auVar66._24_4_ = -auVar70._24_4_;
                auVar66._28_4_ = auVar70._28_4_ ^ 0x80000000;
                auVar88._8_4_ = 0x42b0c0a5;
                auVar88._0_8_ = 0x42b0c0a542b0c0a5;
                auVar88._12_4_ = 0x42b0c0a5;
                auVar88._16_4_ = 0x42b0c0a5;
                auVar88._20_4_ = 0x42b0c0a5;
                auVar88._24_4_ = 0x42b0c0a5;
                auVar88._28_4_ = 0x42b0c0a5;
                auVar90 = vminps_avx(auVar66,auVar88);
                auVar67 = vmaxps_avx(auVar100,auVar90);
                auVar94 = vfmadd213ps_fma(auVar117,auVar67,auVar104);
                auVar50 = vroundps_avx(ZEXT1632(auVar94),1);
                auVar90 = vcmpps_avx(ZEXT1632(auVar94),auVar50,1);
                auVar90 = vandps_avx(auVar90,auVar116);
                auVar90 = vsubps_avx(auVar50,auVar90);
                auVar94 = vfmsub231ps_fma(auVar67,auVar90,auVar85);
                auVar101._8_4_ = 0x395e8083;
                auVar101._0_8_ = 0x395e8083395e8083;
                auVar101._12_4_ = 0x395e8083;
                auVar101._16_4_ = 0x395e8083;
                auVar101._20_4_ = 0x395e8083;
                auVar101._24_4_ = 0x395e8083;
                auVar101._28_4_ = 0x395e8083;
                auVar150 = vfmsub231ps_fma(ZEXT1632(auVar94),auVar90,auVar101);
                auVar67 = ZEXT1632(auVar150);
                auVar15._28_4_ = auVar50._28_4_;
                auVar15._0_28_ =
                     ZEXT1628(CONCAT412(auVar150._12_4_ * auVar150._12_4_,
                                        CONCAT48(auVar150._8_4_ * auVar150._8_4_,
                                                 CONCAT44(auVar150._4_4_ * auVar150._4_4_,
                                                          auVar150._0_4_ * auVar150._0_4_))));
                auVar94 = vfmadd213ps_fma(auVar99,auVar67,auVar140);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar86);
                auVar102._8_4_ = 0x3d2aa9c1;
                auVar102._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar102._12_4_ = 0x3d2aa9c1;
                auVar102._16_4_ = 0x3d2aa9c1;
                auVar102._20_4_ = 0x3d2aa9c1;
                auVar102._24_4_ = 0x3d2aa9c1;
                auVar102._28_4_ = 0x3d2aa9c1;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar102);
                auVar103._8_4_ = 0x3e2aaaaa;
                auVar103._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar103._12_4_ = 0x3e2aaaaa;
                auVar103._16_4_ = 0x3e2aaaaa;
                auVar103._20_4_ = 0x3e2aaaaa;
                auVar103._24_4_ = 0x3e2aaaaa;
                auVar103._28_4_ = 0x3e2aaaaa;
                auVar67 = ZEXT1632(auVar150);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar103);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar104);
                auVar80 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar15,auVar67);
                auVar57._0_4_ = (int)auVar90._0_4_;
                auVar57._4_4_ = (int)auVar90._4_4_;
                auVar57._8_4_ = (int)auVar90._8_4_;
                auVar57._12_4_ = (int)auVar90._12_4_;
                auVar68._16_4_ = (int)auVar90._16_4_;
                auVar68._0_16_ = auVar57;
                auVar68._20_4_ = (int)auVar90._20_4_;
                auVar68._24_4_ = (int)auVar90._24_4_;
                auVar68._28_4_ = (int)auVar90._28_4_;
                auVar150 = vpslld_avx(auVar57,0x17);
                auVar94 = vpslld_avx(auVar68._16_16_,0x17);
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = 0x3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar94 = vpaddd_avx(auVar94,auVar95);
                auVar150 = vpaddd_avx(auVar150,auVar95);
                auVar69._16_16_ = auVar94;
                auVar69._0_16_ = auVar150;
                auVar89._0_4_ = auVar80._0_4_ + auVar118._0_4_;
                auVar89._4_4_ = auVar80._4_4_ + auVar118._4_4_;
                auVar89._8_4_ = auVar80._8_4_ + auVar118._8_4_;
                auVar89._12_4_ = auVar80._12_4_ + auVar118._12_4_;
                auVar89._16_4_ = auVar118._16_4_ + 0.0;
                auVar89._20_4_ = auVar118._20_4_ + 0.0;
                auVar89._24_4_ = auVar118._24_4_ + 0.0;
                auVar89._28_4_ = auVar118._28_4_ + 0.0;
                auVar94 = vfmadd213ps_fma(auVar69,auVar89,auVar116);
                auVar90 = vdivps_avx(auVar116,ZEXT1632(auVar94));
                break;
              case 5:
                auVar158._8_4_ = 0x42b0c0a5;
                auVar158._0_8_ = 0x42b0c0a542b0c0a5;
                auVar158._12_4_ = 0x42b0c0a5;
                auVar158._16_4_ = 0x42b0c0a5;
                auVar158._20_4_ = 0x42b0c0a5;
                auVar158._24_4_ = 0x42b0c0a5;
                auVar158._28_4_ = 0x42b0c0a5;
                auVar90 = vminps_avx(auVar158,auVar67);
                auVar67 = vmaxps_avx(auVar100,auVar90);
                auVar94 = vfmadd213ps_fma(auVar117,auVar67,auVar104);
                auVar50 = vroundps_avx(ZEXT1632(auVar94),1);
                auVar90 = vcmpps_avx(ZEXT1632(auVar94),auVar50,1);
                auVar90 = vandps_avx(auVar90,auVar116);
                auVar90 = vsubps_avx(auVar50,auVar90);
                auVar94 = vfmsub231ps_fma(auVar67,auVar90,auVar85);
                auVar51._8_4_ = 0xb95e8083;
                auVar51._0_8_ = 0xb95e8083b95e8083;
                auVar51._12_4_ = 0xb95e8083;
                auVar51._16_4_ = 0xb95e8083;
                auVar51._20_4_ = 0xb95e8083;
                auVar51._24_4_ = 0xb95e8083;
                auVar51._28_4_ = 0xb95e8083;
                auVar150 = vfnmsub231ps_fma(ZEXT1632(auVar94),auVar90,auVar51);
                auVar51 = ZEXT1632(auVar150);
                auVar67._28_4_ = auVar50._28_4_;
                auVar67._0_28_ =
                     ZEXT1628(CONCAT412(auVar150._12_4_ * auVar150._12_4_,
                                        CONCAT48(auVar150._8_4_ * auVar150._8_4_,
                                                 CONCAT44(auVar150._4_4_ * auVar150._4_4_,
                                                          auVar150._0_4_ * auVar150._0_4_))));
                auVar94 = vfmadd213ps_fma(auVar99,auVar51,auVar140);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar51,auVar86);
                auVar130._8_4_ = 0x3d2aa9c1;
                auVar130._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar130._12_4_ = 0x3d2aa9c1;
                auVar130._16_4_ = 0x3d2aa9c1;
                auVar130._20_4_ = 0x3d2aa9c1;
                auVar130._24_4_ = 0x3d2aa9c1;
                auVar130._28_4_ = 0x3d2aa9c1;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar51,auVar130);
                auVar52._8_4_ = 0x3e2aaaaa;
                auVar52._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar52._12_4_ = 0x3e2aaaaa;
                auVar52._16_4_ = 0x3e2aaaaa;
                auVar52._20_4_ = 0x3e2aaaaa;
                auVar52._24_4_ = 0x3e2aaaaa;
                auVar52._28_4_ = 0x3e2aaaaa;
                auVar50 = ZEXT1632(auVar150);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar50,auVar52);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar50,auVar104);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar50);
                auVar82._0_4_ = auVar94._0_4_ + auVar118._0_4_;
                auVar82._4_4_ = auVar94._4_4_ + auVar118._4_4_;
                auVar82._8_4_ = auVar94._8_4_ + auVar118._8_4_;
                auVar82._12_4_ = auVar94._12_4_ + auVar118._12_4_;
                auVar82._16_4_ = auVar118._16_4_ + 0.0;
                auVar82._20_4_ = auVar118._20_4_ + 0.0;
                auVar82._24_4_ = auVar118._24_4_ + 0.0;
                auVar82._28_4_ = auVar118._28_4_ + 0.0;
                auVar93._0_4_ = (int)auVar90._0_4_;
                auVar93._4_4_ = (int)auVar90._4_4_;
                auVar93._8_4_ = (int)auVar90._8_4_;
                auVar93._12_4_ = (int)auVar90._12_4_;
                auVar96._16_4_ = (int)auVar90._16_4_;
                auVar96._0_16_ = auVar93;
                auVar96._20_4_ = (int)auVar90._20_4_;
                auVar96._24_4_ = (int)auVar90._24_4_;
                auVar96._28_4_ = (int)auVar90._28_4_;
                auVar150 = vpslld_avx(auVar93,0x17);
                auVar94 = vpslld_avx(auVar96._16_16_,0x17);
                auVar49._8_4_ = 0x3f800000;
                auVar49._0_8_ = 0x3f8000003f800000;
                auVar49._12_4_ = 0x3f800000;
                auVar94 = vpaddd_avx(auVar94,auVar49);
                auVar150 = vpaddd_avx(auVar150,auVar49);
                auVar166._16_16_ = auVar94;
                auVar166._0_16_ = auVar150;
                auVar80 = vfmadd213ps_fma(auVar166,auVar82,auVar116);
                auVar53._8_4_ = 0x800000;
                auVar53._0_8_ = 0x80000000800000;
                auVar53._12_4_ = 0x800000;
                auVar53._16_4_ = 0x800000;
                auVar53._20_4_ = 0x800000;
                auVar53._24_4_ = 0x800000;
                auVar53._28_4_ = 0x800000;
                auVar90 = vmaxps_avx(ZEXT1632(auVar80),auVar53);
                auVar150 = vpsrld_avx(auVar90._0_16_,0x17);
                auVar94 = vpsrld_avx(auVar90._16_16_,0x17);
                auVar54._8_4_ = 0x807fffff;
                auVar54._0_8_ = 0x807fffff807fffff;
                auVar54._12_4_ = 0x807fffff;
                auVar54._16_4_ = 0x807fffff;
                auVar54._20_4_ = 0x807fffff;
                auVar54._24_4_ = 0x807fffff;
                auVar54._28_4_ = 0x807fffff;
                auVar90 = vandps_avx(auVar90,auVar54);
                auVar50 = vorps_avx(auVar90,auVar104);
                auVar55._8_4_ = 0x3f3504f3;
                auVar55._0_8_ = 0x3f3504f33f3504f3;
                auVar55._12_4_ = 0x3f3504f3;
                auVar55._16_4_ = 0x3f3504f3;
                auVar55._20_4_ = 0x3f3504f3;
                auVar55._24_4_ = 0x3f3504f3;
                auVar55._28_4_ = 0x3f3504f3;
                auVar67 = vcmpps_avx(auVar55,auVar50,2);
                auVar90 = vandnps_avx(auVar67,auVar50);
                auVar83._0_4_ = auVar90._0_4_ + auVar50._0_4_ + -1.0;
                auVar83._4_4_ = auVar90._4_4_ + auVar50._4_4_ + -1.0;
                auVar83._8_4_ = auVar90._8_4_ + auVar50._8_4_ + -1.0;
                auVar83._12_4_ = auVar90._12_4_ + auVar50._12_4_ + -1.0;
                auVar83._16_4_ = auVar90._16_4_ + auVar50._16_4_ + -1.0;
                auVar83._20_4_ = auVar90._20_4_ + auVar50._20_4_ + -1.0;
                auVar83._24_4_ = auVar90._24_4_ + auVar50._24_4_ + -1.0;
                auVar83._28_4_ = auVar90._28_4_ + auVar50._28_4_ + -1.0;
                auVar94 = vpsubd_avx(auVar94,auVar67._16_16_);
                auVar157._8_4_ = 0xffffff81;
                auVar157._0_8_ = 0xffffff81ffffff81;
                auVar157._12_4_ = 0xffffff81;
                auVar94 = vpaddd_avx(auVar94,auVar157);
                auVar150 = vpsubd_avx(auVar150,auVar67._0_16_);
                auVar150 = vpaddd_avx(auVar157,auVar150);
                auVar97._16_16_ = auVar94;
                auVar97._0_16_ = auVar150;
                auVar50._4_4_ = auVar83._4_4_ * auVar83._4_4_;
                auVar50._0_4_ = auVar83._0_4_ * auVar83._0_4_;
                auVar50._8_4_ = auVar83._8_4_ * auVar83._8_4_;
                auVar50._12_4_ = auVar83._12_4_ * auVar83._12_4_;
                auVar50._16_4_ = auVar83._16_4_ * auVar83._16_4_;
                auVar50._20_4_ = auVar83._20_4_ * auVar83._20_4_;
                auVar50._24_4_ = auVar83._24_4_ * auVar83._24_4_;
                auVar50._28_4_ = auVar67._28_4_;
                auVar155._8_4_ = 0x3d9021bb;
                auVar155._0_8_ = 0x3d9021bb3d9021bb;
                auVar155._12_4_ = 0x3d9021bb;
                auVar155._16_4_ = 0x3d9021bb;
                auVar155._20_4_ = 0x3d9021bb;
                auVar155._24_4_ = 0x3d9021bb;
                auVar155._28_4_ = 0x3d9021bb;
                auVar131._8_4_ = 0xbdebd1b8;
                auVar131._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar131._12_4_ = 0xbdebd1b8;
                auVar131._16_4_ = 0xbdebd1b8;
                auVar131._20_4_ = 0xbdebd1b8;
                auVar131._24_4_ = 0xbdebd1b8;
                auVar131._28_4_ = 0xbdebd1b8;
                auVar94 = vfmadd213ps_fma(auVar155,auVar83,auVar131);
                auVar132._8_4_ = 0x3def251a;
                auVar132._0_8_ = 0x3def251a3def251a;
                auVar132._12_4_ = 0x3def251a;
                auVar132._16_4_ = 0x3def251a;
                auVar132._20_4_ = 0x3def251a;
                auVar132._24_4_ = 0x3def251a;
                auVar132._28_4_ = 0x3def251a;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar132);
                auVar133._8_4_ = 0xbdfe5d4f;
                auVar133._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar133._12_4_ = 0xbdfe5d4f;
                auVar133._16_4_ = 0xbdfe5d4f;
                auVar133._20_4_ = 0xbdfe5d4f;
                auVar133._24_4_ = 0xbdfe5d4f;
                auVar133._28_4_ = 0xbdfe5d4f;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar133);
                auVar134._8_4_ = 0x3e11e9bf;
                auVar134._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar134._12_4_ = 0x3e11e9bf;
                auVar134._16_4_ = 0x3e11e9bf;
                auVar134._20_4_ = 0x3e11e9bf;
                auVar134._24_4_ = 0x3e11e9bf;
                auVar134._28_4_ = 0x3e11e9bf;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar134);
                auVar135._8_4_ = 0xbe2aae50;
                auVar135._0_8_ = 0xbe2aae50be2aae50;
                auVar135._12_4_ = 0xbe2aae50;
                auVar135._16_4_ = 0xbe2aae50;
                auVar135._20_4_ = 0xbe2aae50;
                auVar135._24_4_ = 0xbe2aae50;
                auVar135._28_4_ = 0xbe2aae50;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar135);
                auVar136._8_4_ = 0x3e4cceac;
                auVar136._0_8_ = 0x3e4cceac3e4cceac;
                auVar136._12_4_ = 0x3e4cceac;
                auVar136._16_4_ = 0x3e4cceac;
                auVar136._20_4_ = 0x3e4cceac;
                auVar136._24_4_ = 0x3e4cceac;
                auVar136._28_4_ = 0x3e4cceac;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar136);
                auVar137._8_4_ = 0xbe7ffffc;
                auVar137._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar137._12_4_ = 0xbe7ffffc;
                auVar137._16_4_ = 0xbe7ffffc;
                auVar137._20_4_ = 0xbe7ffffc;
                auVar137._24_4_ = 0xbe7ffffc;
                auVar137._28_4_ = 0xbe7ffffc;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar137);
                auVar138._8_4_ = 0x3eaaaaaa;
                auVar138._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar138._12_4_ = 0x3eaaaaaa;
                auVar138._16_4_ = 0x3eaaaaaa;
                auVar138._20_4_ = 0x3eaaaaaa;
                auVar138._24_4_ = 0x3eaaaaaa;
                auVar138._28_4_ = 0x3eaaaaaa;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar83,auVar138);
                auVar156._0_4_ = auVar83._0_4_ * auVar83._0_4_ * auVar83._0_4_ * auVar94._0_4_;
                auVar156._4_4_ = auVar83._4_4_ * auVar83._4_4_ * auVar83._4_4_ * auVar94._4_4_;
                auVar156._8_4_ = auVar83._8_4_ * auVar83._8_4_ * auVar83._8_4_ * auVar94._8_4_;
                auVar156._12_4_ = auVar83._12_4_ * auVar83._12_4_ * auVar83._12_4_ * auVar94._12_4_;
                auVar156._16_4_ = auVar83._16_4_ * auVar83._16_4_ * auVar83._16_4_ * 0.0;
                auVar156._20_4_ = auVar83._20_4_ * auVar83._20_4_ * auVar83._20_4_ * 0.0;
                auVar156._24_4_ = auVar83._24_4_ * auVar83._24_4_ * auVar83._24_4_ * 0.0;
                auVar156._28_4_ = 0;
                auVar160 = ZEXT3264(auVar100);
                auVar161 = ZEXT3264(auVar117);
                auVar162 = ZEXT3264(auVar140);
                auVar149 = ZEXT3264(auVar99);
                auVar142 = ZEXT3264(auVar85);
                auVar147 = ZEXT3264(auVar86);
                auVar114 = ZEXT3264(auVar104);
                auVar56 = ZEXT864(0) << 0x20;
                auVar67 = vcvtdq2ps_avx(auVar97);
                auVar159._8_4_ = 0xb95e8083;
                auVar159._0_8_ = 0xb95e8083b95e8083;
                auVar159._12_4_ = 0xb95e8083;
                auVar159._16_4_ = 0xb95e8083;
                auVar159._20_4_ = 0xb95e8083;
                auVar159._24_4_ = 0xb95e8083;
                auVar159._28_4_ = 0xb95e8083;
                auVar94 = vfmadd231ps_fma(auVar156,auVar67,auVar159);
                auVar94 = vfmsub231ps_fma(ZEXT1632(auVar94),auVar104,auVar50);
                auVar90 = vcmpps_avx(ZEXT1632(auVar80),ZEXT832(0) << 0x20,2);
                auVar50 = vsubps_avx(ZEXT1632(auVar94),auVar83);
                auVar94 = vfmsub231ps_fma(auVar50,auVar85,auVar67);
                auVar167._8_4_ = 0xc0000000;
                auVar167._0_8_ = 0xc0000000c0000000;
                auVar167._12_4_ = 0xc0000000;
                auVar167._16_4_ = 0xc0000000;
                auVar167._20_4_ = 0xc0000000;
                auVar167._24_4_ = 0xc0000000;
                auVar167._28_4_ = 0xc0000000;
                auVar84._0_4_ = auVar94._0_4_ * -2.0;
                auVar84._4_4_ = auVar94._4_4_ * -2.0;
                auVar84._8_4_ = auVar94._8_4_ * -2.0;
                auVar84._12_4_ = auVar94._12_4_ * -2.0;
                auVar84._16_4_ = 0x80000000;
                auVar84._20_4_ = 0x80000000;
                auVar84._24_4_ = 0x80000000;
                auVar84._28_4_ = 0;
                auVar98._8_4_ = 0x7fffffff;
                auVar98._0_8_ = 0x7fffffff7fffffff;
                auVar98._12_4_ = 0x7fffffff;
                auVar98._16_4_ = 0x7fffffff;
                auVar98._20_4_ = 0x7fffffff;
                auVar98._24_4_ = 0x7fffffff;
                auVar98._28_4_ = 0x7fffffff;
                auVar90 = vblendvps_avx(auVar84,auVar98,auVar90);
                auVar90 = vminps_avx(auVar90,auVar158);
                auVar67 = vmaxps_avx(auVar100,auVar90);
                auVar94 = vfmadd213ps_fma(auVar117,auVar67,auVar104);
                auVar50 = vroundps_avx(ZEXT1632(auVar94),1);
                auVar90 = vcmpps_avx(ZEXT1632(auVar94),auVar50,1);
                auVar139._8_4_ = 0x3f800000;
                auVar139._0_8_ = 0x3f8000003f800000;
                auVar139._12_4_ = 0x3f800000;
                auVar139._16_4_ = 0x3f800000;
                auVar139._20_4_ = 0x3f800000;
                auVar139._24_4_ = 0x3f800000;
                auVar139._28_4_ = 0x3f800000;
                auVar90 = vandps_avx(auVar90,auVar139);
                auVar90 = vsubps_avx(auVar50,auVar90);
                auVar94 = vfmsub231ps_fma(auVar67,auVar90,auVar85);
                auVar150 = vfnmsub231ps_fma(ZEXT1632(auVar94),auVar90,auVar159);
                auVar67 = ZEXT1632(auVar150);
                auVar116._28_4_ = auVar50._28_4_;
                auVar116._0_28_ =
                     ZEXT1628(CONCAT412(auVar150._12_4_ * auVar150._12_4_,
                                        CONCAT48(auVar150._8_4_ * auVar150._8_4_,
                                                 CONCAT44(auVar150._4_4_ * auVar150._4_4_,
                                                          auVar150._0_4_ * auVar150._0_4_))));
                auVar94 = vfmadd213ps_fma(auVar99,auVar67,auVar140);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar86);
                auVar140._8_4_ = 0x3d2aa9c1;
                auVar140._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar140._12_4_ = 0x3d2aa9c1;
                auVar140._16_4_ = 0x3d2aa9c1;
                auVar140._20_4_ = 0x3d2aa9c1;
                auVar140._24_4_ = 0x3d2aa9c1;
                auVar140._28_4_ = 0x3d2aa9c1;
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar140);
                auVar141._8_4_ = 0x3e2aaaaa;
                auVar141._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar141._12_4_ = 0x3e2aaaaa;
                auVar141._16_4_ = 0x3e2aaaaa;
                auVar141._20_4_ = 0x3e2aaaaa;
                auVar141._24_4_ = 0x3e2aaaaa;
                auVar141._28_4_ = 0x3e2aaaaa;
                auVar67 = ZEXT1632(auVar150);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar141);
                auVar94 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar67,auVar104);
                auVar80 = vfmadd213ps_fma(ZEXT1632(auVar94),auVar116,auVar67);
                auVar117._8_4_ = 0x3f800000;
                auVar117._0_8_ = 0x3f8000003f800000;
                auVar117._12_4_ = 0x3f800000;
                auVar117._16_4_ = 0x3f800000;
                auVar117._20_4_ = 0x3f800000;
                auVar117._24_4_ = 0x3f800000;
                auVar117._28_4_ = 0x3f800000;
                auVar118 = ZEXT3264(auVar117);
                auVar71._0_4_ = (int)auVar90._0_4_;
                auVar71._4_4_ = (int)auVar90._4_4_;
                auVar71._8_4_ = (int)auVar90._8_4_;
                auVar71._12_4_ = (int)auVar90._12_4_;
                auVar85._16_4_ = (int)auVar90._16_4_;
                auVar85._0_16_ = auVar71;
                auVar85._20_4_ = (int)auVar90._20_4_;
                auVar85._24_4_ = (int)auVar90._24_4_;
                auVar85._28_4_ = (int)auVar90._28_4_;
                auVar150 = vpslld_avx(auVar71,0x17);
                auVar94 = vpslld_avx(auVar85._16_16_,0x17);
                auVar119._8_4_ = 0x3f800000;
                auVar119._0_8_ = 0x3f8000003f800000;
                auVar119._12_4_ = 0x3f800000;
                auVar94 = vpaddd_avx(auVar94,auVar119);
                auVar150 = vpaddd_avx(auVar150,auVar119);
                auVar86._16_16_ = auVar94;
                auVar86._0_16_ = auVar150;
                auVar99._0_4_ = auVar80._0_4_ + 1.0;
                auVar99._4_4_ = auVar80._4_4_ + 1.0;
                auVar99._8_4_ = auVar80._8_4_ + 1.0;
                auVar99._12_4_ = auVar80._12_4_ + 1.0;
                auVar99._16_4_ = 0x3f800000;
                auVar99._20_4_ = 0x3f800000;
                auVar99._24_4_ = 0x3f800000;
                auVar99._28_4_ = 0x3f800000;
                auVar94 = vfmadd213ps_fma(auVar86,auVar99,auVar117);
                auVar90 = vdivps_avx(auVar117,ZEXT1632(auVar94));
                auVar100._8_4_ = 0xbf800000;
                auVar100._0_8_ = 0xbf800000bf800000;
                auVar100._12_4_ = 0xbf800000;
                auVar100._16_4_ = 0xbf800000;
                auVar100._20_4_ = 0xbf800000;
                auVar100._24_4_ = 0xbf800000;
                auVar100._28_4_ = 0xbf800000;
                auVar94 = vfnmadd213ps_fma(auVar90,auVar167,auVar100);
                auVar169 = ZEXT1664(auVar94);
                goto LAB_003ec782;
              case 6:
                puVar11 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar1 = *puVar11;
                auVar90._4_4_ = uVar1;
                auVar90._0_4_ = uVar1;
                auVar90._8_4_ = uVar1;
                auVar90._12_4_ = uVar1;
                auVar90._16_4_ = uVar1;
                auVar90._20_4_ = uVar1;
                auVar90._24_4_ = uVar1;
                auVar90._28_4_ = uVar1;
                uVar1 = puVar11[1];
                auVar104._4_4_ = uVar1;
                auVar104._0_4_ = uVar1;
                auVar104._8_4_ = uVar1;
                auVar104._12_4_ = uVar1;
                auVar104._16_4_ = uVar1;
                auVar104._20_4_ = uVar1;
                auVar104._24_4_ = uVar1;
                auVar104._28_4_ = uVar1;
                auVar94 = vfmadd231ps_fma(auVar104,auVar67,auVar90);
                auVar90 = vmaxps_avx(ZEXT1632(auVar94),auVar50);
                auVar90 = vminps_avx(auVar90,auVar116);
                auVar169 = ZEXT3264(auVar90);
LAB_003ec782:
                auVar91._0_4_ = auVar169._0_4_ * auVar70._0_4_;
                auVar91._4_4_ = auVar169._4_4_ * auVar70._4_4_;
                auVar91._8_4_ = auVar169._8_4_ * auVar70._8_4_;
                auVar91._12_4_ = auVar169._12_4_ * auVar70._12_4_;
                auVar91._16_4_ = auVar169._16_4_ * auVar70._16_4_;
                auVar91._20_4_ = auVar169._20_4_ * auVar70._20_4_;
                auVar91._28_36_ = auVar169._28_36_;
                auVar91._24_4_ = auVar169._24_4_ * auVar70._24_4_;
                auVar90 = auVar91._0_32_;
              }
switchD_003ec368_caseD_1:
              *pauVar37 = auVar90;
              pauVar37 = pauVar37 + 1;
              iVar2 = iVar2 + 1;
            }
          }
          iVar25 = iVar25 + iVar21 * 8;
        }
      }
    }
    else {
      uVar32 = (long)(int)(iVar25 * uVar46) / (long)iVar9;
      uVar29 = (long)iVar21 / (long)iVar9;
      if (opt->use_packing_layout == true) {
        uVar46 = (uint)((uVar32 & 3) == 0) * 3 + 1;
        if ((uVar32 & 7) == 0) {
          uVar46 = 8;
        }
        _elempack = (uint)((uVar29 & 3) == 0) * 3 + 1;
        if ((uVar29 & 7) == 0) {
          _elempack = 8;
        }
      }
      else {
        uVar46 = 1;
        _elempack = uVar46;
      }
      piVar10 = bottom_blob->refcount;
      local_178.data = bottom_blob->data;
      local_178.refcount = bottom_blob->refcount;
      local_178.elemsize = bottom_blob->elemsize;
      local_178.elempack = bottom_blob->elempack;
      local_178.allocator = bottom_blob->allocator;
      local_178.dims = bottom_blob->dims;
      local_178.w = bottom_blob->w;
      local_178.h = bottom_blob->h;
      local_178.d = bottom_blob->d;
      local_178.c = bottom_blob->c;
      local_178.cstep = bottom_blob->cstep;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_288 = uVar32 & 0xffffffff;
      uVar43 = local_288;
      local_2b8 = uVar29 & 0xffffffff;
      uVar38 = uVar29;
      if ((int)uVar46 < iVar25) {
        opt_p.lightmode = opt->lightmode;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_ops = opt->use_subgroup_ops;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.vulkan_device_index = opt->vulkan_device_index;
        opt_p.use_reserved_1 = opt->use_reserved_1;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_2 = opt->use_reserved_2;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_fp16_uniform = opt->use_fp16_uniform;
        opt_p.use_int8_uniform = opt->use_int8_uniform;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_178,uVar46,&opt_p);
        if (local_178.data == (void *)0x0) {
          iVar26 = -100;
          bVar16 = false;
        }
        else {
          uVar38 = uVar29 & 0xffffffff;
          if ((long)local_178.c * local_178.cstep != 0) goto LAB_003ec90f;
          bVar16 = false;
          iVar26 = -100;
        }
      }
      else {
LAB_003ec90f:
        sVar17 = local_228.cstep;
        piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        opt_p.blob_allocator =
             (Allocator *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        opt_p._0_8_ = local_228.data;
        opt_p.workspace_allocator = (Allocator *)local_228.elemsize;
        opt_p.openmp_blocktime = local_228.elempack;
        opt_p._32_8_ = local_228.allocator;
        opt_p._44_4_ = local_228.w;
        opt_p.vulkan_device_index = local_228.dims;
        opt_p._48_8_ = local_228._48_8_;
        opt_p.use_winograd43_convolution = (bool)(undefined1)local_228.c;
        opt_p.use_winograd63_convolution = (bool)local_228.c._1_1_;
        opt_p.use_a53_a55_optimized_kernel = (bool)local_228.c._2_1_;
        opt_p.use_fp16_uniform = (bool)local_228.c._3_1_;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        if (_elempack < uVar33) {
          Mat::create((Mat *)&opt_p,iVar35,iVar40,
                      (this->super_DeconvolutionDepthWise).num_output / (int)_elempack,
                      (ulong)_elempack * (sVar41 / uVar33),_elempack,opt->workspace_allocator);
          if (opt_p._0_8_ != 0) {
            uVar38 = uVar29 & 0xffffffff;
            if ((long)(int)opt_p._56_4_ * sVar17 != 0) goto LAB_003eca0a;
          }
LAB_003ed79f:
          iVar26 = -100;
          bVar16 = false;
        }
        else {
LAB_003eca0a:
          iVar25 = 0;
          iVar34 = 0;
          lVar44 = 0;
          uVar47 = uVar32;
          do {
            if ((this->super_DeconvolutionDepthWise).group <= lVar44) {
              if (_elempack < uVar33) {
                convert_packing((Mat *)&opt_p,&local_228,uVar33,opt);
                if ((local_228.data == (void *)0x0) || ((long)local_228.c * local_228.cstep == 0))
                goto LAB_003ed79f;
              }
              else {
                if (opt_p.blob_allocator != (Allocator *)0x0) {
                  LOCK();
                  *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                       *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                  UNLOCK();
                }
                piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (local_228.allocator == (Allocator *)0x0) {
                      free(local_228.data);
                    }
                    else {
                      (*(local_228.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar19 = opt_p._56_8_;
                local_228.data = (void *)opt_p._0_8_;
                local_228.refcount._0_4_ = SUB84(opt_p.blob_allocator,0);
                local_228.refcount._4_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
                local_228.elemsize = (size_t)opt_p.workspace_allocator;
                local_228.elempack = opt_p.openmp_blocktime;
                local_228.allocator = (Allocator *)opt_p._32_8_;
                local_228.dims = opt_p.vulkan_device_index;
                local_228.w = opt_p._44_4_;
                local_228._48_8_ = opt_p._48_8_;
                local_228.c._0_1_ = opt_p.use_winograd43_convolution;
                local_228.c._1_1_ = opt_p.use_winograd63_convolution;
                local_228.c._2_1_ = opt_p.use_a53_a55_optimized_kernel;
                local_228.c._3_1_ = opt_p.use_fp16_uniform;
                local_228.cstep = sVar17;
                opt_p._56_8_ = uVar19;
              }
              iVar26 = -100;
              bVar16 = true;
              goto LAB_003ed880;
            }
            m.c = (int)uVar47 / (int)uVar46;
            m.data = (void *)((long)(iVar25 / (int)uVar46) * local_178.cstep * local_178.elemsize +
                             (long)local_178.data);
            m.refcount = (int *)0x0;
            m.elemsize = local_178.elemsize;
            m.elempack = local_178.elempack;
            m.allocator = local_178.allocator;
            m.cstep = ((long)local_178.d * local_178.elemsize *
                       (long)local_178.h * (long)local_178.w + 0xf & 0xfffffffffffffff0) /
                      local_178.elemsize;
            m.dims = local_178.dims;
            m.w = local_178.w;
            m.h = local_178.h;
            m.d = local_178.d;
            m_1.c = (int)uVar38 / (int)_elempack;
            m_1.data = (void *)((long)(iVar34 / (int)_elempack) * sVar17 *
                                (long)opt_p.workspace_allocator + opt_p._0_8_);
            m_1.refcount = (int *)0x0;
            m_1.elemsize = (size_t)opt_p.workspace_allocator;
            m_1.elempack = opt_p.openmp_blocktime;
            m_1.allocator = (Allocator *)opt_p._32_8_;
            m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                         (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
            m_1._40_8_ = opt_p._40_8_;
            m_1._48_8_ = opt_p._48_8_;
            pLVar12 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar44];
            opt_g.lightmode = opt->lightmode;
            opt_g.use_shader_pack8 = opt->use_shader_pack8;
            opt_g.use_subgroup_ops = opt->use_subgroup_ops;
            opt_g.use_reserved_0 = opt->use_reserved_0;
            opt_g.num_threads = opt->num_threads;
            opt_g.workspace_allocator = opt->workspace_allocator;
            opt_g.openmp_blocktime = opt->openmp_blocktime;
            opt_g.use_winograd_convolution = opt->use_winograd_convolution;
            opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_g.use_int8_inference = opt->use_int8_inference;
            opt_g.use_vulkan_compute = opt->use_vulkan_compute;
            opt_g.use_bf16_storage = opt->use_bf16_storage;
            opt_g.use_fp16_packed = opt->use_fp16_packed;
            opt_g.use_fp16_storage = opt->use_fp16_storage;
            opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_g.use_int8_packed = opt->use_int8_packed;
            opt_g.use_int8_storage = opt->use_int8_storage;
            opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_g.use_packing_layout = opt->use_packing_layout;
            opt_g.vulkan_device_index = opt->vulkan_device_index;
            opt_g.use_reserved_1 = opt->use_reserved_1;
            opt_g.use_image_storage = opt->use_image_storage;
            opt_g.use_tensor_storage = opt->use_tensor_storage;
            opt_g.use_reserved_2 = opt->use_reserved_2;
            opt_g.flush_denormals = opt->flush_denormals;
            opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
            opt_g.use_shader_local_memory = opt->use_shader_local_memory;
            opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
            opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
            opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
            opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
            opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
            opt_g.use_fp16_uniform = opt->use_fp16_uniform;
            opt_g.use_int8_uniform = opt->use_int8_uniform;
            opt_g.use_reserved_9 = opt->use_reserved_9;
            opt_g.use_reserved_10 = opt->use_reserved_10;
            opt_g.use_reserved_11 = opt->use_reserved_11;
            opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
            iVar26 = (*pLVar12->_vptr_Layer[7])(pLVar12,&m,&m_1,&opt_g);
            local_288._0_4_ = (int)uVar32;
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + -1;
              UNLOCK();
              if (*m_1.refcount == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (m.refcount != (int *)0x0) {
              LOCK();
              *m.refcount = *m.refcount + -1;
              UNLOCK();
              if (*m.refcount == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  free(m.data);
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            lVar44 = lVar44 + 1;
            iVar34 = iVar34 + (int)uVar29;
            iVar25 = iVar25 + (int)local_288;
            uVar47 = uVar43;
            uVar38 = local_2b8;
          } while (iVar26 == 0);
          bVar16 = false;
        }
LAB_003ed880:
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
      }
      if (local_178.refcount != (int *)0x0) {
        LOCK();
        *local_178.refcount = *local_178.refcount + -1;
        UNLOCK();
        if (*local_178.refcount == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar16) goto LAB_003ed937;
    }
    pMVar18 = local_1d0;
    DeconvolutionDepthWise::cut_padding
              (&this->super_DeconvolutionDepthWise,&local_228,local_1d0,opt);
    if ((pMVar18->data != (void *)0x0) && (iVar26 = 0, (long)local_1d0->c * local_1d0->cstep != 0))
    goto LAB_003ed937;
  }
  iVar26 = -100;
LAB_003ed937:
  piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        free(local_228.data);
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}